

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

longlong mg_store_body(mg_connection *conn,char *path)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  mg_file *in_RCX;
  char *in_RDX;
  mg_file_stat *filep;
  ulong __n;
  char *__s;
  longlong lStack_2080;
  mg_file fi;
  char buf [8192];
  
  if (conn->consumed_content == 0) {
    fi.stat.is_directory = 0;
    fi.stat.is_gzipped = 0;
    fi.stat.location = 0;
    fi.stat._28_4_ = 0;
    fi.access.fp = (FILE *)0x0;
    fi.stat.size = 0;
    fi.stat.last_modified = 0;
    __s = path + 2;
    bVar1 = true;
    while (pcVar4 = strchr(__s,0x2f), pcVar4 != (char *)0x0) {
      __n = (long)pcVar4 - (long)path;
      if (0xfff < __n) {
        return -1;
      }
      memcpy((mg_connection *)buf,path,__n);
      buf[__n] = '\0';
      iVar2 = mg_stat((mg_connection *)buf,(char *)&fi,filep);
      if ((iVar2 == 0) && (iVar2 = mkdir(buf,0x1ed), iVar2 != 0)) {
        return -2;
      }
      __s = pcVar4 + 1;
      if (pcVar4[1] == '\0') {
        bVar1 = false;
      }
    }
    if (bVar1) {
      iVar2 = mg_fopen((mg_connection *)path,(char *)0x2,(int)&fi,in_RCX);
      if (iVar2 == 0) {
        lStack_2080 = -0xc;
      }
      else {
        uVar3 = mg_read(conn,buf,0x2000);
        lStack_2080 = 0;
        while (0 < (int)uVar3) {
          sVar5 = fwrite(buf,1,(ulong)uVar3,(FILE *)fi.access.fp);
          if (uVar3 != (uint)sVar5) {
            mg_fclose(&fi.access);
            remove_bad_file(conn,path);
            return -0xd;
          }
          lStack_2080 = lStack_2080 + (ulong)uVar3;
          uVar3 = mg_read(conn,buf,0x2000);
        }
        iVar2 = mg_fclose(&fi.access);
        if (iVar2 != 0) {
          remove_bad_file(conn,path);
          lStack_2080 = -0xe;
        }
      }
    }
    else {
      lStack_2080 = 0;
    }
  }
  else {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,in_RDX,(uint)in_RCX,"%s: Contents already consumed",
               "mg_store_body");
    lStack_2080 = -0xb;
  }
  return lStack_2080;
}

Assistant:

CIVETWEB_API long long
mg_store_body(struct mg_connection *conn, const char *path)
{
	char buf[MG_BUF_LEN];
	long long len = 0;
	int ret, n;
	struct mg_file fi;

	if (conn->consumed_content != 0) {
		mg_cry_internal(conn, "%s: Contents already consumed", __func__);
		return -11;
	}

	ret = put_dir(conn, path);
	if (ret < 0) {
		/* -1 for path too long,
		 * -2 for path can not be created. */
		return ret;
	}
	if (ret != 1) {
		/* Return 0 means, path itself is a directory. */
		return 0;
	}

	if (mg_fopen(conn, path, MG_FOPEN_MODE_WRITE, &fi) == 0) {
		return -12;
	}

	ret = mg_read(conn, buf, sizeof(buf));
	while (ret > 0) {
		n = (int)fwrite(buf, 1, (size_t)ret, fi.access.fp);
		if (n != ret) {
			(void)mg_fclose(
			    &fi.access); /* File is bad and will be removed anyway. */
			remove_bad_file(conn, path);
			return -13;
		}
		len += ret;
		ret = mg_read(conn, buf, sizeof(buf));
	}

	/* File is open for writing. If fclose fails, there was probably an
	 * error flushing the buffer to disk, so the file on disk might be
	 * broken. Delete it and return an error to the caller. */
	if (mg_fclose(&fi.access) != 0) {
		remove_bad_file(conn, path);
		return -14;
	}

	return len;
}